

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_8x16(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  JSAMPROW pJVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  DCTELEM *pDVar28;
  long lVar29;
  int *piVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  uint uVar41;
  int iVar42;
  DCTELEM workspace [64];
  int local_138 [8];
  int aiStack_118 [8];
  int aiStack_f8 [8];
  int aiStack_d8 [8];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  uVar17 = (ulong)start_col;
  lVar22 = 0;
  pDVar28 = data;
  do {
    pJVar16 = sample_data[lVar22];
    uVar37 = (uint)pJVar16[uVar17] + (uint)pJVar16[uVar17 + 7];
    uVar35 = (uint)pJVar16[uVar17 + 1] + (uint)pJVar16[uVar17 + 6];
    uVar41 = (uint)pJVar16[uVar17 + 2] + (uint)pJVar16[uVar17 + 5];
    uVar24 = (uint)pJVar16[uVar17 + 3] + (uint)pJVar16[uVar17 + 4];
    lVar26 = (ulong)uVar37 - (ulong)uVar24;
    iVar25 = uVar24 + uVar37;
    lVar38 = (ulong)uVar35 - (ulong)uVar41;
    iVar42 = uVar41 + uVar35;
    lVar40 = (ulong)pJVar16[uVar17] - (ulong)pJVar16[uVar17 + 7];
    lVar21 = (ulong)pJVar16[uVar17 + 1] - (ulong)pJVar16[uVar17 + 6];
    lVar33 = (ulong)pJVar16[uVar17 + 2] - (ulong)pJVar16[uVar17 + 5];
    lVar20 = (ulong)pJVar16[uVar17 + 3] - (ulong)pJVar16[uVar17 + 4];
    *pDVar28 = (iVar25 + iVar42) * 4 + -0x1000;
    pDVar28[4] = (iVar25 - iVar42) * 4;
    lVar29 = (lVar26 + lVar38) * 0x1151;
    pDVar28[2] = (int)(lVar26 * 0x187e + lVar29 + 0x400U >> 0xb);
    pDVar28[6] = (int)(lVar29 + lVar38 * 0x7ffffffc4df + 0x400U >> 0xb);
    lVar29 = (lVar20 + lVar21 + lVar33 + lVar40) * 0x25a1;
    lVar26 = (lVar33 + lVar40) * -0xc7c + lVar29;
    lVar29 = (lVar20 + lVar21) * -0x3ec5 + lVar29;
    lVar38 = (lVar20 + lVar40) * -0x1ccd;
    pDVar28[1] = (int)((ulong)(lVar40 * 0x300b + lVar38 + 0x400 + lVar26) >> 0xb);
    lVar40 = (lVar33 + lVar21) * -0x5203;
    pDVar28[3] = (int)((ulong)(lVar21 * 0x6254 + lVar40 + 0x400 + lVar29) >> 0xb);
    pDVar28[5] = (int)((ulong)(lVar33 * 0x41b3 + lVar40 + 0x400 + lVar26) >> 0xb);
    pDVar28[7] = (int)((ulong)(lVar20 * 0x98e + lVar38 + 0x400 + lVar29) >> 0xb);
    piVar30 = local_138;
    if ((int)lVar22 != 7) {
      if ((int)lVar22 == 0xf) {
        lVar22 = 0;
        for (iVar25 = 7; -1 < iVar25; iVar25 = iVar25 + -1) {
          iVar42 = *(int *)((long)aiStack_58 + lVar22);
          iVar1 = *(int *)((long)data + lVar22);
          iVar2 = *(int *)((long)data + lVar22 + 0x20);
          lVar31 = (long)(iVar42 + iVar1);
          iVar3 = *(int *)((long)aiStack_78 + lVar22);
          lVar27 = (long)(iVar3 + iVar2);
          iVar4 = *(int *)((long)data + lVar22 + 0x40);
          iVar5 = *(int *)((long)aiStack_98 + lVar22);
          iVar6 = *(int *)((long)data + lVar22 + 0xc0);
          iVar7 = *(int *)((long)local_138 + lVar22);
          iVar8 = *(int *)((long)aiStack_118 + lVar22);
          lVar26 = (long)(iVar8 + iVar6);
          iVar9 = *(int *)((long)data + lVar22 + 0xe0);
          lVar21 = (long)(iVar9 + iVar7);
          lVar20 = lVar21 + lVar31;
          lVar31 = lVar31 - lVar21;
          lVar21 = lVar26 + lVar27;
          lVar27 = lVar27 - lVar26;
          lVar39 = (long)(iVar5 + iVar4);
          iVar10 = *(int *)((long)data + lVar22 + 0xa0);
          iVar11 = *(int *)((long)aiStack_f8 + lVar22);
          lVar29 = (long)(iVar11 + iVar10);
          lVar26 = lVar29 + lVar39;
          lVar39 = lVar39 - lVar29;
          iVar12 = *(int *)((long)data + lVar22 + 0x60);
          iVar13 = *(int *)((long)aiStack_b8 + lVar22);
          lVar34 = (long)(iVar13 + iVar12);
          iVar14 = *(int *)((long)data + lVar22 + 0x80);
          iVar15 = *(int *)((long)aiStack_d8 + lVar22);
          lVar38 = (long)(iVar15 + iVar14);
          lVar29 = lVar38 + lVar34;
          lVar34 = lVar34 - lVar38;
          *(int *)((long)data + lVar22) = (int)(lVar29 + lVar26 + lVar21 + lVar20 + 4U >> 3);
          lVar38 = (long)(iVar1 - iVar42);
          lVar33 = (long)(iVar2 - iVar3);
          lVar40 = (long)(iVar4 - iVar5);
          lVar18 = (long)(iVar12 - iVar13);
          lVar19 = (long)(iVar14 - iVar15);
          lVar32 = (long)(iVar10 - iVar11);
          lVar36 = (long)(iVar6 - iVar8);
          lVar23 = (long)(iVar9 - iVar7);
          *(int *)((long)data + lVar22 + 0x80) =
               (int)((ulong)((lVar21 - lVar26) * 0x1151 + (lVar20 - lVar29) * 0x29cf + 0x8000) >>
                    0x10);
          lVar20 = (lVar31 - lVar39) * 0x2c63 + (lVar34 - lVar27) * 0x8d4;
          *(int *)((long)data + lVar22 + 0x40) =
               (int)((ulong)(lVar39 * 0x4587 + lVar20 + 0x8000 + lVar27 * 0x2e75) >> 0x10);
          *(int *)((long)data + lVar22 + 0xc0) =
               (int)((ulong)(lVar34 * 0xffffffffde07 + lVar20 + 0x8000 + lVar31 * 0xfffffffff93e) >>
                    0x10);
          lVar31 = (lVar36 - lVar23) * 0xd23 + (lVar33 + lVar38) * 0x2b4e;
          lVar20 = (lVar23 + lVar32) * 0x1555 + (lVar40 + lVar38) * 0x27e9;
          lVar26 = (lVar19 - lVar23) * 0x1cb6 + (lVar18 + lVar38) * 0x22fc;
          lVar27 = (lVar36 - lVar32) * 0x2d09 + (lVar40 + lVar33) * 0x470;
          lVar29 = (lVar36 + lVar19) * -0x27e9 + (lVar18 + lVar33) * -0x1555;
          lVar21 = (lVar32 - lVar19) * 0xd23 + (lVar18 + lVar40) * -0x2b4e;
          *(int *)((long)data + lVar22 + 0x20) =
               (int)((ulong)(lVar23 * 0x18f3 + lVar38 * 0xffffffffb6d6 + lVar20 + lVar31 + lVar26 +
                            0x8000) >> 0x10);
          *(int *)((long)data + lVar22 + 0x60) =
               (int)((ulong)(lVar31 + lVar27 + lVar36 * 0xffffffffcac1 + lVar33 * 0x24d + lVar29 +
                            0x8000) >> 0x10);
          *(int *)((long)data + lVar22 + 0xa0) =
               (int)((ulong)(lVar32 * 0x2747 + lVar27 + lVar40 * -0x2406 + lVar21 + 0x8000 + lVar20)
                    >> 0x10);
          *(int *)((long)data + lVar22 + 0xe0) =
               (int)((ulong)(lVar19 * 0x4560 + lVar29 + lVar18 * 0x2218 + lVar21 + 0x8000 + lVar26)
                    >> 0x10);
          lVar22 = lVar22 + 4;
        }
        return;
      }
      piVar30 = pDVar28 + 8;
    }
    lVar22 = lVar22 + 1;
    pDVar28 = piVar30;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_8x16 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16, tmp17;
  INT32 z1;
  DCTELEM workspace[DCTSIZE2];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]);

    tmp10 = tmp0 + tmp3;
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) ((tmp10 + tmp11 - 8 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[4] = (DCTELEM) ((tmp10 - tmp11) << PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    dataptr[2] = (DCTELEM) DESCALE(z1 + MULTIPLY(tmp12, FIX_0_765366865),
				   CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM) DESCALE(z1 - MULTIPLY(tmp13, FIX_1_847759065),
				   CONST_BITS-PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * 8-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[1] = (DCTELEM) DESCALE(tmp0 + tmp10 + tmp12, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp1 + tmp11 + tmp13, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp2 + tmp11 + tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp3 + tmp10 + tmp13, CONST_BITS-PASS1_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == DCTSIZE * 2)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by 8/16 = 1/2.
   * 16-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/32).
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*3];
    tmp5 = dataptr[DCTSIZE*5] + wsptr[DCTSIZE*2];
    tmp6 = dataptr[DCTSIZE*6] + wsptr[DCTSIZE*1];
    tmp7 = dataptr[DCTSIZE*7] + wsptr[DCTSIZE*0];

    tmp10 = tmp0 + tmp7;
    tmp14 = tmp0 - tmp7;
    tmp11 = tmp1 + tmp6;
    tmp15 = tmp1 - tmp6;
    tmp12 = tmp2 + tmp5;
    tmp16 = tmp2 - tmp5;
    tmp13 = tmp3 + tmp4;
    tmp17 = tmp3 - tmp4;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*3];
    tmp5 = dataptr[DCTSIZE*5] - wsptr[DCTSIZE*2];
    tmp6 = dataptr[DCTSIZE*6] - wsptr[DCTSIZE*1];
    tmp7 = dataptr[DCTSIZE*7] - wsptr[DCTSIZE*0];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(tmp10 + tmp11 + tmp12 + tmp13, PASS1_BITS+1);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.306562965)) + /* c4[16] = c2[8] */
	      MULTIPLY(tmp11 - tmp12, FIX_0_541196100),   /* c12[16] = c6[8] */
	      CONST_BITS+PASS1_BITS+1);

    tmp10 = MULTIPLY(tmp17 - tmp15, FIX(0.275899379)) +   /* c14[16] = c7[8] */
	    MULTIPLY(tmp14 - tmp16, FIX(1.387039845));    /* c2[16] = c1[8] */

    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp15, FIX(1.451774982))   /* c6+c14 */
	      + MULTIPLY(tmp16, FIX(2.172734804)),        /* c2+c10 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(0.211164243))   /* c2-c6 */
	      - MULTIPLY(tmp17, FIX(1.061594338)),        /* c10+c14 */
	      CONST_BITS+PASS1_BITS+1);

    /* Odd part */

    tmp11 = MULTIPLY(tmp0 + tmp1, FIX(1.353318001)) +         /* c3 */
	    MULTIPLY(tmp6 - tmp7, FIX(0.410524528));          /* c13 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.247225013)) +         /* c5 */
	    MULTIPLY(tmp5 + tmp7, FIX(0.666655658));          /* c11 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(1.093201867)) +         /* c7 */
	    MULTIPLY(tmp4 - tmp7, FIX(0.897167586));          /* c9 */
    tmp14 = MULTIPLY(tmp1 + tmp2, FIX(0.138617169)) +         /* c15 */
	    MULTIPLY(tmp6 - tmp5, FIX(1.407403738));          /* c1 */
    tmp15 = MULTIPLY(tmp1 + tmp3, - FIX(0.666655658)) +       /* -c11 */
	    MULTIPLY(tmp4 + tmp6, - FIX(1.247225013));        /* -c5 */
    tmp16 = MULTIPLY(tmp2 + tmp3, - FIX(1.353318001)) +       /* -c3 */
	    MULTIPLY(tmp5 - tmp4, FIX(0.410524528));          /* c13 */
    tmp10 = tmp11 + tmp12 + tmp13 -
	    MULTIPLY(tmp0, FIX(2.286341144)) +                /* c7+c5+c3-c1 */
	    MULTIPLY(tmp7, FIX(0.779653625));                 /* c15+c13-c11+c9 */
    tmp11 += tmp14 + tmp15 + MULTIPLY(tmp1, FIX(0.071888074)) /* c9-c3-c15+c11 */
	     - MULTIPLY(tmp6, FIX(1.663905119));              /* c7+c13+c1-c5 */
    tmp12 += tmp14 + tmp16 - MULTIPLY(tmp2, FIX(1.125726048)) /* c7+c5+c15-c3 */
	     + MULTIPLY(tmp5, FIX(1.227391138));              /* c9-c11+c1-c13 */
    tmp13 += tmp15 + tmp16 + MULTIPLY(tmp3, FIX(1.065388962)) /* c15+c3+c11-c7 */
	     + MULTIPLY(tmp4, FIX(2.167985692));              /* c1+c13+c5-c9 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp10, CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp11, CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp12, CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp13, CONST_BITS+PASS1_BITS+1);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}